

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luma_quantizer.cpp
# Opt level: O3

string * __thiscall
LumaQuantizer::name_abi_cxx11_(string *__return_storage_ptr__,LumaQuantizer *this,ptf_t ptf)

{
  char *pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((uint)this < 5) {
    pcVar1 = &DAT_001ab4a0 + *(int *)(&DAT_001ab4a0 + ((ulong)this & 0xffffffff) * 4);
  }
  else {
    pcVar1 = "Undefined";
  }
  std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string LumaQuantizer::name(ptf_t ptf)
{
    std::string name;
    switch (ptf)
    {
    case PTF_PQ:
        name = "Perceptual quantizer (PQ, SMPTE ST 2084)";
        break;
    case PTF_LOG:
        name = "Logarithmic";
        break;
    case PTF_JND_HDRVDP:
        name = "JND HDR-VDP";
        break;
    case PTF_PSI:
        name = "Perceptual - Ferwerda's t.v.i.";
        break;
    case PTF_LINEAR:
        name = "Linear scaling";
        break;
    default:
        name = "Undefined";
    }
    
    return name;
}